

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

bool __thiscall libwebm::Webm2Pes::InitWebmParser(Webm2Pes *this)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  Tracks *this_00;
  SegmentInfo *this_01;
  unsigned_long uVar4;
  Track *this_02;
  char *__s;
  size_t sVar5;
  unsigned_long uVar6;
  bool bVar7;
  string codec_id;
  Segment *webm_parser;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  Segment *local_38;
  
  iVar1 = mkvparser::MkvReader::Open(&this->webm_reader_,(this->input_file_name_)._M_dataplus._M_p);
  if (iVar1 == 0) {
    local_38 = (pointer)0x0;
    lVar2 = mkvparser::Segment::CreateInstance
                      (&(this->webm_reader_).super_IMkvReader,0,&local_38,kTypeSeekable);
    if (lVar2 == 0) {
      std::__uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::reset
                ((__uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_> *)
                 &this->webm_parser_,local_38);
      lVar3 = mkvparser::Segment::Load
                        ((this->webm_parser_)._M_t.
                         super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>
                         .super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl);
      if (lVar3 == 0) {
        this_00 = mkvparser::Segment::GetTracks
                            ((this->webm_parser_)._M_t.
                             super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>
                             .super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl);
        if (this_00 == (Tracks *)0x0) {
          InitWebmParser(this);
        }
        else {
          this_01 = mkvparser::Segment::GetInfo
                              ((this->webm_parser_)._M_t.
                               super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>
                               .super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl);
          lVar2 = mkvparser::SegmentInfo::GetTimeCodeScale(this_01);
          this->timecode_scale_ = lVar2;
          uVar4 = mkvparser::Tracks::GetTracksCount(this_00);
          if (0 < (int)uVar4) {
            uVar4 = 0;
            do {
              this_02 = mkvparser::Tracks::GetTrackByIndex(this_00,uVar4);
              iVar1 = 0;
              if (this_02 != (Track *)0x0) {
                lVar3 = mkvparser::Track::GetType(this_02);
                iVar1 = 0;
                if (lVar3 == 1) {
                  __s = mkvparser::Track::GetCodecId(this_02);
                  if (__s == (char *)0x0) {
                    __s = "";
                  }
                  local_58 = local_48;
                  sVar5 = strlen(__s);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_58,__s,__s + sVar5);
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"V_VP8","");
                  if (local_50 == local_70) {
                    if (local_50 == 0) {
                      bVar7 = true;
                    }
                    else {
                      iVar1 = bcmp(local_58,local_78,local_50);
                      bVar7 = iVar1 == 0;
                    }
                  }
                  else {
                    bVar7 = false;
                  }
                  if (local_78 != local_68) {
                    operator_delete(local_78);
                  }
                  if (bVar7) {
                    this->codec_ = kVP8;
LAB_0010db9a:
                    this->video_track_num_ = (int)uVar4 + 1;
                    iVar1 = 2;
                  }
                  else {
                    local_78 = local_68;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"V_VP9","");
                    if (local_50 == local_70) {
                      if (local_50 == 0) {
                        bVar7 = true;
                      }
                      else {
                        iVar1 = bcmp(local_58,local_78,local_50);
                        bVar7 = iVar1 == 0;
                      }
                    }
                    else {
                      bVar7 = false;
                    }
                    if (local_78 != local_68) {
                      operator_delete(local_78);
                    }
                    if (bVar7) {
                      this->codec_ = kVP9;
                      goto LAB_0010db9a;
                    }
                    InitWebmParser();
                    iVar1 = 1;
                  }
                  if (local_58 != local_48) {
                    operator_delete(local_58);
                  }
                }
              }
              if (iVar1 != 0) goto LAB_0010dbe7;
              uVar4 = uVar4 + 1;
              uVar6 = mkvparser::Tracks::GetTracksCount(this_00);
            } while ((long)uVar4 < (long)(int)uVar6);
            iVar1 = 2;
LAB_0010dbe7:
            if (iVar1 != 2) {
              return false;
            }
          }
          if (0 < this->video_track_num_) {
            return true;
          }
          InitWebmParser(this);
        }
      }
      else {
        InitWebmParser(this);
      }
    }
    else {
      InitWebmParser();
    }
  }
  else {
    InitWebmParser(this);
  }
  return false;
}

Assistant:

bool Webm2Pes::InitWebmParser() {
  if (webm_reader_.Open(input_file_name_.c_str()) != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot open %s as input.\n",
                 input_file_name_.c_str());
    return false;
  }

  using mkvparser::Segment;
  Segment* webm_parser = nullptr;
  if (Segment::CreateInstance(&webm_reader_, 0 /* pos */,
                              webm_parser /* Segment*& */) != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot create WebM parser.\n");
    return false;
  }
  webm_parser_.reset(webm_parser);

  if (webm_parser_->Load() != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot parse %s.\n",
                 input_file_name_.c_str());
    return false;
  }

  // Make sure there's a video track.
  const mkvparser::Tracks* tracks = webm_parser_->GetTracks();
  if (tracks == nullptr) {
    std::fprintf(stderr, "Webm2Pes: %s has no tracks.\n",
                 input_file_name_.c_str());
    return false;
  }

  timecode_scale_ = webm_parser_->GetInfo()->GetTimeCodeScale();

  for (int track_index = 0;
       track_index < static_cast<int>(tracks->GetTracksCount());
       ++track_index) {
    const mkvparser::Track* track = tracks->GetTrackByIndex(track_index);
    if (track && track->GetType() == mkvparser::Track::kVideo) {
      const std::string codec_id = ToString(track->GetCodecId());
      if (codec_id == std::string("V_VP8")) {
        codec_ = VideoFrame::kVP8;
      } else if (codec_id == std::string("V_VP9")) {
        codec_ = VideoFrame::kVP9;
      } else {
        fprintf(stderr, "Webm2Pes: Codec must be VP8 or VP9.\n");
        return false;
      }
      video_track_num_ = track_index + 1;
      break;
    }
  }
  if (video_track_num_ < 1) {
    std::fprintf(stderr, "Webm2Pes: No video track found in %s.\n",
                 input_file_name_.c_str());
    return false;
  }
  return true;
}